

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O1

size_t __thiscall
Assimp::IFC::anon_unknown_9::CompositeCurve::EstimateSampleCount
          (CompositeCurve *this,IfcFloat a,IfcFloat b)

{
  pointer ppVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  CurveEntry *entry;
  pointer ppVar4;
  bool bVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar6;
  double dVar7;
  IfcFloat IVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  IVar8 = b;
  (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])();
  iVar2 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
  if (((char)iVar2 == '\0') &&
     ((a - extraout_XMM0_Qa <= -1.1920928955078125e-07 || (IVar8 - a <= -1.1920928955078125e-07))))
  {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x104,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::CompositeCurve::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  IVar8 = a;
  (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])(this);
  dVar9 = IVar8;
  iVar2 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
  if (((char)iVar2 == '\0') &&
     ((b - extraout_XMM0_Qa_00 <= -1.1920928955078125e-07 || (IVar8 - b <= -1.1920928955078125e-07))
     )) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x105,
                  "virtual size_t Assimp::IFC::(anonymous namespace)::CompositeCurve::EstimateSampleCount(IfcFloat, IfcFloat) const"
                 );
  }
  ppVar4 = (this->curves).
           super__Vector_base<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->curves).
           super__Vector_base<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>,_std::allocator<std::pair<std::shared_ptr<Assimp::IFC::BoundedCurve>,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  sVar3 = 0;
  if (ppVar4 != ppVar1) {
    dVar11 = 0.0;
    do {
      (*(((ppVar4->first).super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_Curve)._vptr_Curve[5])();
      dVar6 = ABS(dVar9 - extraout_XMM0_Qa_01);
      if ((dVar11 <= b) && (a <= dVar11 + dVar6)) {
        dVar10 = a - dVar11;
        if (dVar10 <= 0.0) {
          dVar10 = 0.0;
        }
        dVar12 = b - dVar11;
        if (dVar6 <= b - dVar11) {
          dVar12 = dVar6;
        }
        bVar5 = ppVar4->second != false;
        if (bVar5) {
          dVar7 = dVar10 + extraout_XMM0_Qa_01;
          if (!bVar5) goto LAB_005d4d8f;
LAB_005d4d7f:
          dVar9 = extraout_XMM0_Qa_01 + dVar12;
        }
        else {
          dVar7 = dVar9 - dVar12;
          if (bVar5) goto LAB_005d4d7f;
LAB_005d4d8f:
          dVar9 = dVar9 - dVar10;
        }
        iVar2 = (*(((ppVar4->first).
                    super___shared_ptr<Assimp::IFC::BoundedCurve,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   )->super_Curve)._vptr_Curve[6])(dVar7);
        sVar3 = sVar3 + CONCAT44(extraout_var,iVar2);
      }
      ppVar4 = ppVar4 + 1;
      dVar11 = dVar11 + dVar6;
    } while (ppVar4 != ppVar1);
  }
  return sVar3;
}

Assistant:

size_t EstimateSampleCount(IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );
        size_t cnt = 0;

        IfcFloat acc = 0;
        for(const CurveEntry& entry : curves) {
            const ParamRange& range = entry.first->GetParametricRange();
            const IfcFloat delta = std::abs(range.second-range.first);
            if (a <= acc+delta && b >= acc) {
                const IfcFloat at =  std::max(static_cast<IfcFloat>( 0. ),a-acc), bt = std::min(delta,b-acc);
                cnt += entry.first->EstimateSampleCount( entry.second ? at + range.first : range.second - bt, entry.second ? bt + range.first : range.second - at );
            }

            acc += delta;
        }

        return cnt;
    }